

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

int __thiscall QtMWidgets::NavigationBarPrivate::init(NavigationBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  NavigationBar *pNVar1;
  ColorGroup CVar2;
  int iVar3;
  QStackedWidget *this_00;
  NavigationButton *pNVar4;
  TextLabel *this_01;
  long *plVar5;
  undefined4 *puVar6;
  QVBoxLayout *this_02;
  QGridLayout *pQVar7;
  QFont f;
  code *local_58;
  undefined8 local_50;
  QObject local_40 [8];
  QObject local_38 [8];
  
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  this_00 = (QStackedWidget *)operator_new(0x28);
  QStackedWidget::QStackedWidget(this_00,&this->q->super_QWidget);
  this->stack = this_00;
  QFrame::setFrameStyle((int)this_00);
  pNVar4 = (NavigationButton *)operator_new(0x30);
  NavigationButton::NavigationButton(pNVar4,Left,&this->q->super_QWidget);
  this->left = pNVar4;
  pNVar4 = (NavigationButton *)operator_new(0x30);
  NavigationButton::NavigationButton(pNVar4,Right,&this->q->super_QWidget);
  this->right = pNVar4;
  this_01 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(this_01,&this->q->super_QWidget,(WindowFlags)0x0);
  this->title = this_01;
  CVar2 = QWidget::palette();
  plVar5 = (long *)QPalette::brush(CVar2,Dark);
  TextLabel::setColor(this_01,(QColor *)(*plVar5 + 8));
  pNVar1 = this->q;
  pNVar4 = this->left;
  local_58 = QAbstractButton::clicked;
  local_50 = 0;
  _f = NavigationBar::showPreviousScreen;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::NavigationBar::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = NavigationBar::showPreviousScreen;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pNVar4,(QObject *)&local_58,(void **)pNVar1,(QSlotObjectBase *)&f,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pNVar1 = this->q;
  pNVar4 = this->right;
  local_58 = QAbstractButton::clicked;
  local_50 = 0;
  _f = NavigationBar::showNextScreen;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::NavigationBar::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = NavigationBar::showNextScreen;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pNVar4,(QObject *)&local_58,(void **)pNVar1,(QSlotObjectBase *)&f,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  TextLabel::textOption((TextLabel *)&local_58);
  local_58 = (code *)((ulong)local_58 & 0xffffffffffffe000 | 0x84);
  TextLabel::setTextOption(this->title,(QTextOption *)&local_58);
  QFont::QFont(&f,(QFont *)(*(long *)&this->title->field_0x20 + 0x38));
  QFont::setWeight((Weight)&f);
  QFont::pointSize();
  QFont::setPointSize((int)&f);
  TextLabel::setFont(this->title,&f);
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,&this->q->super_QWidget);
  (**(code **)(*(long *)this_02 + 0x68))(this_02,0);
  QLayout::setContentsMargins((int)this_02,3,3,3);
  pQVar7 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar7,(QWidget *)0x0);
  this->grid = pQVar7;
  QGridLayout::addWidget(pQVar7,this->left,0,0,0);
  QGridLayout::addWidget(this->grid,this->title,0,1,0);
  QGridLayout::addWidget(this->grid,this->right,0,2,0);
  pQVar7 = this->grid;
  FingerGeometry::height();
  QGridLayout::setRowMinimumHeight((int)pQVar7,0);
  QWidget::hide();
  QWidget::hide();
  QBoxLayout::addLayout((QLayout *)this_02,(int)this->grid);
  QBoxLayout::addWidget(this_02,this->stack,0,0);
  QFont::~QFont(&f);
  iVar3 = QTextOption::~QTextOption((QTextOption *)&local_58);
  return iVar3;
}

Assistant:

void
NavigationBarPrivate::init()
{
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	stack = new QStackedWidget( q );
	stack->setFrameStyle( QFrame::NoFrame | QFrame::Plain );

	left = new NavigationButton( NavigationButton::Left, q );
	right = new NavigationButton( NavigationButton::Right, q );
	title = new TextLabel( q );
	title->setColor( q->palette().color( QPalette::Highlight ) );

	QObject::connect( left, &NavigationButton::clicked,
		q, &NavigationBar::showPreviousScreen );
	QObject::connect( right, &NavigationButton::clicked,
		q, &NavigationBar::showNextScreen );

	QTextOption opt = title->textOption();
	opt.setAlignment( Qt::AlignCenter );
	opt.setWrapMode( QTextOption::NoWrap );

	title->setTextOption( opt );

	QFont f = title->font();
	f.setBold( true );
	f.setPointSize( f.pointSize() + 1 );

	title->setFont( f );

	QVBoxLayout * layout = new QVBoxLayout( q );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 3, 3, 3, 3 );

	grid = new QGridLayout;
	grid->addWidget( left, 0, 0 );
	grid->addWidget( title, 0, 1 );
	grid->addWidget( right, 0, 2 );
	grid->setRowMinimumHeight( 0, FingerGeometry::height() );

	left->hide();
	right->hide();

	layout->addLayout( grid );
	layout->addWidget( stack );
}